

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,ByteData *key_bytes)

{
  ByteData local_50;
  ByteData local_38;
  ByteData *local_20;
  ByteData *key_bytes_local;
  ByteData *pBStack_10;
  uint8_t type_local;
  
  local_20 = key_bytes;
  key_bytes_local._7_1_ = type;
  pBStack_10 = __return_storage_ptr__;
  ByteData::ByteData(&local_38,type);
  ByteData::Serialize(&local_50,local_20);
  ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr__,&local_38,&local_50);
  ByteData::~ByteData((ByteData *)0x46e9d9);
  ByteData::~ByteData((ByteData *)0x46e9e2);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const ByteData &key_bytes) {
  return ByteData(type).Concat(key_bytes.Serialize());
}